

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O3

ssize_t amqp_ssl_socket_recv(void *base,void *buf,size_t len,int flags)

{
  uint ret_code;
  int iVar1;
  ulong uVar2;
  
  ERR_clear_error();
  *(undefined4 *)((long)base + 0x34) = 0;
  ret_code = SSL_read(*(SSL **)((long)base + 0x18),buf,(int)len);
  uVar2 = (ulong)ret_code;
  if ((int)ret_code < 1) {
    iVar1 = SSL_get_error(*(SSL **)((long)base + 0x18),ret_code);
    *(int *)((long)base + 0x34) = iVar1;
    uVar2 = 0xfffffffffffffe00;
    if (iVar1 == 6) {
      uVar2 = 0xfffffffffffffff9;
    }
  }
  return uVar2;
}

Assistant:

static ssize_t
amqp_ssl_socket_recv(void *base,
                     void *buf,
                     size_t len,
                     AMQP_UNUSED int flags)
{
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  ssize_t received;
  ERR_clear_error();
  self->internal_error = 0;

  received = SSL_read(self->ssl, buf, len);
  if (0 >= received) {
    self->internal_error = SSL_get_error(self->ssl, received);
    switch(self->internal_error) {
    case SSL_ERROR_ZERO_RETURN:
      received = AMQP_STATUS_CONNECTION_CLOSED;
      break;
    default:
      received = AMQP_STATUS_SSL_ERROR;
      break;
    }
  }

  return received;
}